

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O1

ulong __thiscall nuraft::inmem_log_store::next_slot(inmem_log_store *this)

{
  __int_type _Var1;
  size_t sVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->logs_lock_);
  if (iVar3 == 0) {
    _Var1 = (this->start_idx_).super___atomic_base<unsigned_long>._M_i;
    sVar2 = (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
    return (_Var1 + sVar2) - 1;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

ulong inmem_log_store::next_slot() const {
    std::lock_guard<std::mutex> l(logs_lock_);
    // Exclude the dummy entry.
    return start_idx_ + logs_.size() - 1;
}